

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseModelWithMultipleComponentHierarchyWaterfalls_Test::
Parser_parseModelWithMultipleComponentHierarchyWaterfalls_Test
          (Parser_parseModelWithMultipleComponentHierarchyWaterfalls_Test *this)

{
  Parser_parseModelWithMultipleComponentHierarchyWaterfalls_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this =
       &PTR__Parser_parseModelWithMultipleComponentHierarchyWaterfalls_Test_00185498;
  return;
}

Assistant:

TEST(Parser, parseModelWithMultipleComponentHierarchyWaterfalls)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"ignatio\"/>\n"
        "  <component name=\"dave\"/>\n"
        "  <component name=\"bob\"/>\n"
        "  <component name=\"angus\"/>\n"
        "  <component name=\"jackie\"/>\n"
        "  <component name=\"mildred\"/>\n"
        "  <component name=\"sue\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"dave\">\n"
        "      <component_ref component=\"bob\">\n"
        "        <component_ref component=\"angus\"/>\n"
        "        <component_ref component=\"jackie\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "    <component_ref component=\"mildred\">\n"
        "      <component_ref component=\"sue\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}